

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall
QListView::currentChanged(QListView *this,QModelIndex *current,QModelIndex *previous)

{
  long lVar1;
  bool bVar2;
  int chld;
  ulong uVar3;
  QWidget *in_RSI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int entry;
  QAccessibleEvent event;
  QModelIndex *this_00;
  QModelIndex *in_stack_ffffffffffffffd8;
  QAbstractItemView *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  QAbstractItemView::currentChanged(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_RDI);
  uVar3 = QAccessible::isActive();
  if ((((uVar3 & 1) != 0) && (bVar2 = QModelIndex::isValid(in_RDI), bVar2)) &&
     (bVar2 = QWidget::hasFocus(in_RSI), bVar2)) {
    chld = visualIndex((QListView *)this_00,(QModelIndex *)in_RSI);
    QAccessibleEvent::QAccessibleEvent
              ((QAccessibleEvent *)&stack0xffffffffffffffd8,(QObject *)in_RDI,Focus);
    QAccessibleEvent::setChild((QAccessibleEvent *)&stack0xffffffffffffffd8,chld);
    QAccessible::updateAccessibility((QAccessibleEvent *)&stack0xffffffffffffffd8);
    QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&stack0xffffffffffffffd8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::currentChanged(const QModelIndex &current, const QModelIndex &previous)
{
    QAbstractItemView::currentChanged(current, previous);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        if (current.isValid() && hasFocus()) {
            int entry = visualIndex(current);
            QAccessibleEvent event(this, QAccessible::Focus);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}